

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O0

void glob_initfromgui(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  t_symbol *ptVar4;
  _binbuf *x;
  size_t size_00;
  t_float tVar5;
  _binbuf *b;
  int height;
  int width;
  int size;
  int j;
  int did_fontwarning;
  uint i;
  t_namelist *nl;
  char *cwd;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  void *dummy_local;
  
  ptVar4 = atom_getsymbolarg(0,argc,argv);
  pcVar1 = ptVar4->s_name;
  bVar2 = false;
  tVar5 = atom_getfloatarg(1,argc,argv);
  sys_oldtclversion = (int)tVar5;
  if (argc != 0x26) {
    bug("glob_initfromgui");
  }
  for (width = 0; width < 2; width = width + 1) {
    for (j = 0; (uint)j < 6; j = j + 1) {
      tVar5 = atom_getfloatarg((j + width * 6) * 3 + 2,argc,argv);
      height = (int)tVar5;
      tVar5 = atom_getfloatarg((j + width * 6) * 3 + 3,argc,argv);
      b._4_4_ = (int)tVar5;
      tVar5 = atom_getfloatarg((j + width * 6) * 3 + 4,argc,argv);
      b._0_4_ = (int)tVar5;
      if (((height == 0) || (b._4_4_ == 0)) || ((int)b == 0)) {
        height = (width + 1) * sys_fontspec[(uint)j].fi_pointsize;
        b._4_4_ = (width + 1) * sys_fontspec[(uint)j].fi_width;
        b._0_4_ = (width + 1) * sys_fontspec[(uint)j].fi_height;
        if (!bVar2) {
          logpost((void *)0x0,4,"ignoring invalid font-metrics from GUI");
          bVar2 = true;
        }
      }
      sys_gotfonts[width][(uint)j].fi_pointsize = height;
      sys_gotfonts[width][(uint)j].fi_width = b._4_4_;
      sys_gotfonts[width][(uint)j].fi_height = (int)b;
    }
  }
  iVar3 = sys_oktoloadfiles(0);
  if (iVar3 != 0) {
    for (_did_fontwarning = (pd_maininstance.pd_stuff)->st_externlist;
        _did_fontwarning != (t_namelist *)0x0; _did_fontwarning = _did_fontwarning->nl_next) {
      iVar3 = sys_load_lib((_glist *)0x0,_did_fontwarning->nl_string);
      if (iVar3 == 0) {
        post("%s: can\'t load library",_did_fontwarning->nl_string);
      }
    }
    sys_oktoloadfiles(1);
  }
  for (_did_fontwarning = sys_openlist; _did_fontwarning != (t_namelist *)0x0;
      _did_fontwarning = _did_fontwarning->nl_next) {
    openit(pcVar1,_did_fontwarning->nl_string);
  }
  namelist_free(sys_openlist);
  sys_openlist = (t_namelist *)0x0;
  for (_did_fontwarning = sys_messagelist; _did_fontwarning != (t_namelist *)0x0;
      _did_fontwarning = _did_fontwarning->nl_next) {
    x = binbuf_new();
    pcVar1 = _did_fontwarning->nl_string;
    size_00 = strlen(_did_fontwarning->nl_string);
    binbuf_text(x,pcVar1,size_00);
    binbuf_eval(x,(t_pd *)0x0,0,(t_atom *)0x0);
    binbuf_free(x);
  }
  namelist_free(sys_messagelist);
  sys_messagelist = (t_namelist *)0x0;
  return;
}

Assistant:

void glob_initfromgui(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    const char *cwd = atom_getsymbolarg(0, argc, argv)->s_name;
    t_namelist *nl;
    unsigned int i;
    int did_fontwarning = 0;
    int j;
    sys_oldtclversion = atom_getfloatarg(1, argc, argv);
    if (argc != 2 + 3 * NZOOM * NFONT)
        bug("glob_initfromgui");
    for (j = 0; j < NZOOM; j++)
        for (i = 0; i < NFONT; i++)
    {
        int size   = atom_getfloatarg(3 * (i + j * NFONT) + 2, argc, argv);
        int width  = atom_getfloatarg(3 * (i + j * NFONT) + 3, argc, argv);
        int height = atom_getfloatarg(3 * (i + j * NFONT) + 4, argc, argv);
        if (!(size && width && height))
        {
            size   = (j+1)*sys_fontspec[i].fi_pointsize;
            width  = (j+1)*sys_fontspec[i].fi_width;
            height = (j+1)*sys_fontspec[i].fi_height;
            if (!did_fontwarning)
            {
                logpost(NULL, PD_VERBOSE, "ignoring invalid font-metrics from GUI");
                did_fontwarning = 1;
            }
        }
        sys_gotfonts[j][i].fi_pointsize = size;
        sys_gotfonts[j][i].fi_width = width;
        sys_gotfonts[j][i].fi_height = height;
#if 0
            fprintf(stderr, "font (%d %d %d)\n",
                sys_gotfonts[j][i].fi_pointsize, sys_gotfonts[j][i].fi_width,
                    sys_gotfonts[j][i].fi_height);
#endif
    }
        /* load dynamic libraries specified with "-lib" args */
    if (sys_oktoloadfiles(0))
    {
        for  (nl = STUFF->st_externlist; nl; nl = nl->nl_next)
            if (!sys_load_lib(0, nl->nl_string))
                post("%s: can't load library", nl->nl_string);
        sys_oktoloadfiles(1);
    }
        /* open patches specifies with "-open" args */
    for  (nl = sys_openlist; nl; nl = nl->nl_next)
        openit(cwd, nl->nl_string);
    namelist_free(sys_openlist);
    sys_openlist = 0;
        /* send messages specified with "-send" args */
    for  (nl = sys_messagelist; nl; nl = nl->nl_next)
    {
        t_binbuf *b = binbuf_new();
        binbuf_text(b, nl->nl_string, strlen(nl->nl_string));
        binbuf_eval(b, 0, 0, 0);
        binbuf_free(b);
    }
    namelist_free(sys_messagelist);
    sys_messagelist = 0;
}